

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSampleWrapC.cpp
# Opt level: O2

void tsgGenUniformSamples
               (int num_dimensions,int num_samples,double *lower,double *upper,char *random_type,
               int random_seed,tsg_dream_random random_callback,double *samples)

{
  bool bVar1;
  unsigned_long __res;
  ulong uVar2;
  time_t tVar3;
  int size;
  minstd_rand park_miller;
  vector<double,_std::allocator<double>_> result;
  string rtype;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  long local_d8;
  _Vector_base<double,_std::allocator<double>_> local_d0;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  _Vector_base<double,_std::allocator<double>_> local_a0;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  function<double_()> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (random_seed == -1) {
    uVar2 = time((time_t *)0x0);
  }
  else {
    uVar2 = (ulong)random_seed;
  }
  size = 0x7fffffff;
  local_d8 = uVar2 % 0x7fffffff + (ulong)(uVar2 % 0x7fffffff == 0);
  local_88 = 0;
  uStack_84 = 0;
  uStack_80 = 0;
  uStack_7c = 0x3ff00000;
  if (random_seed == -1) {
    size = 0x7fffffff;
    tVar3 = time((time_t *)0x0);
    random_seed = (int)tVar3;
  }
  srand(random_seed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,random_type,(allocator<char> *)local_f8._M_pod_data);
  bVar1 = std::operator==(&local_50,"default");
  if (bVar1) {
    local_f8._M_unused._M_object = (tsg_dream_random *)0x0;
    local_f8._8_8_ = (long *)0x0;
    local_e0 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:82:20)>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:82:20)>
               ::_M_manager;
  }
  else {
    bVar1 = std::operator==(&local_50,"minstd_rand");
    if (bVar1) {
      local_f8._M_unused._M_object = &local_88;
      local_f8._8_8_ = &local_d8;
      local_e0 = std::
                 _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:84:20)>
                 ::_M_invoke;
      local_e8 = std::
                 _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:84:20)>
                 ::_M_manager;
    }
    else {
      local_f8._8_8_ = (long *)0x0;
      local_f8._M_unused._M_object = &random_callback;
      local_e0 = std::
                 _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:86:20)>
                 ::_M_invoke;
      local_e8 = std::
                 _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/tsgDreamSampleWrapC.cpp:86:20)>
                 ::_M_manager;
    }
  }
  TasGrid::Utils::copyArray<double_const,int>
            ((vector<double,_std::allocator<double>_> *)&local_b8,(Utils *)lower,
             (double *)(ulong)(uint)num_dimensions,size);
  TasGrid::Utils::copyArray<double_const,int>
            ((vector<double,_std::allocator<double>_> *)&local_d0,(Utils *)upper,
             (double *)(ulong)(uint)num_dimensions,size);
  std::function<double_()>::function(&local_70,(function<double_()> *)&local_f8);
  TasDREAM::genUniformSamples
            ((vector<double,_std::allocator<double>_> *)&local_a0,
             (vector<double,_std::allocator<double>_> *)&local_b8,
             (vector<double,_std::allocator<double>_> *)&local_d0,num_samples,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  if ((long)local_a0._M_impl.super__Vector_impl_data._M_finish -
      (long)local_a0._M_impl.super__Vector_impl_data._M_start != 0) {
    memmove(samples,local_a0._M_impl.super__Vector_impl_data._M_start,
            (long)local_a0._M_impl.super__Vector_impl_data._M_finish -
            (long)local_a0._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void tsgGenUniformSamples(int num_dimensions, int num_samples, double const lower[], double const upper[],
                          const char* random_type, int random_seed, tsg_dream_random random_callback, double *samples){

    std::minstd_rand park_miller((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    srand((unsigned int) ((random_seed == -1) ? static_cast<long unsigned>(std::time(nullptr)) : random_seed));
    std::string rtype(random_type);

    auto randgen = [&]()->
    std::function<double(void)>{
        if (rtype == "default"){
            return [&]()->double{ return tsgCoreUniform01(); };
        }else if (rtype == "minstd_rand"){
            return [&]()->double{ return unif(park_miller); };
        }else{
            return [&]()->double{ return random_callback(); };
        }
    }();

    std::vector<double> result = TasDREAM::genUniformSamples(Utils::copyArray(lower, num_dimensions),
                                                             Utils::copyArray(upper, num_dimensions),
                                                             num_samples, randgen);
    std::copy(result.begin(), result.end(), samples);
}